

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# high_pass_filter_impl.cc
# Opt level: O2

void __thiscall
webrtc::HighPassFilterImpl::ProcessCaptureAudio(HighPassFilterImpl *this,AudioBuffer *audio)

{
  pointer puVar1;
  __uniq_ptr_impl<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>
  this_00;
  int16_t *data;
  string *psVar2;
  int16_t **ppiVar3;
  size_t length;
  ostream *poVar4;
  size_t i;
  ulong channel;
  size_t local_1b0;
  CritScope cs;
  FatalMessage local_1a0;
  
  if (audio == (AudioBuffer *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/high_pass_filter_impl.cc"
               ,0x69);
    poVar4 = std::operator<<((ostream *)&local_1a0,"Check failed: audio");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<(poVar4,"# ");
  }
  else {
    rtc::CritScope::CritScope(&cs,this->crit_);
    if (this->enabled_ != true) {
LAB_00182525:
      rtc::CritScope::~CritScope(&cs);
      return;
    }
    local_1b0 = CONCAT44(local_1b0._4_4_,0xa0);
    local_1a0._0_8_ = AudioBuffer::num_frames_per_band(audio);
    psVar2 = rtc::CheckGEImpl<unsigned_int,unsigned_long>
                       ((uint *)&local_1b0,(unsigned_long *)&local_1a0,
                        "160u >= audio->num_frames_per_band()");
    if (psVar2 == (string *)0x0) {
      local_1a0._0_8_ =
           (long)(this->filters_).
                 super__Vector_base<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>,_std::allocator<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->filters_).
                 super__Vector_base<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>,_std::allocator<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
      local_1b0 = AudioBuffer::num_channels(audio);
      psVar2 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                         ((unsigned_long *)&local_1a0,&local_1b0,
                          "filters_.size() == audio->num_channels()");
      if (psVar2 == (string *)0x0) {
        for (channel = 0;
            puVar1 = (this->filters_).
                     super__Vector_base<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>,_std::allocator<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            channel < (ulong)((long)(this->filters_).
                                    super__Vector_base<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>,_std::allocator<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
            channel = channel + 1) {
          this_00._M_t.
          super__Tuple_impl<0UL,_webrtc::HighPassFilterImpl::BiquadFilter_*,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>
          .super__Head_base<0UL,_webrtc::HighPassFilterImpl::BiquadFilter_*,_false>._M_head_impl =
               puVar1[channel]._M_t.
               super___uniq_ptr_impl<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>
               ._M_t;
          ppiVar3 = AudioBuffer::split_bands(audio,channel);
          data = *ppiVar3;
          length = AudioBuffer::num_frames_per_band(audio);
          BiquadFilter::Process
                    ((BiquadFilter *)
                     this_00._M_t.
                     super__Tuple_impl<0UL,_webrtc::HighPassFilterImpl::BiquadFilter_*,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>
                     .super__Head_base<0UL,_webrtc::HighPassFilterImpl::BiquadFilter_*,_false>.
                     _M_head_impl,data,length);
        }
        goto LAB_00182525;
      }
      rtc::FatalMessage::FatalMessage
                (&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/high_pass_filter_impl.cc"
                 ,0x70,psVar2);
    }
    else {
      rtc::FatalMessage::FatalMessage
                (&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/high_pass_filter_impl.cc"
                 ,0x6f,psVar2);
    }
  }
  rtc::FatalMessage::~FatalMessage(&local_1a0);
}

Assistant:

void HighPassFilterImpl::ProcessCaptureAudio(AudioBuffer* audio) {
  RTC_DCHECK(audio);
  rtc::CritScope cs(crit_);
  if (!enabled_) {
    return;
  }

  RTC_DCHECK_GE(160u, audio->num_frames_per_band());
  RTC_DCHECK_EQ(filters_.size(), audio->num_channels());
  for (size_t i = 0; i < filters_.size(); i++) {
    filters_[i]->Process(audio->split_bands(i)[kBand0To8kHz],
                         audio->num_frames_per_band());
  }
}